

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_decoder.c
# Opt level: O2

lzma_ret lzma_block_decoder_init(lzma_next_coder *next,lzma_allocator *allocator,lzma_block *block)

{
  uint uVar1;
  uint32_t uVar2;
  lzma_ret lVar3;
  lzma_vli lVar4;
  undefined4 *puVar5;
  lzma_check type;
  bool bVar6;
  
  if ((code *)next->init != lzma_block_decoder_init) {
    lzma_next_end(next,allocator);
  }
  next->init = (uintptr_t)lzma_block_decoder_init;
  lVar4 = lzma_block_unpadded_size(block);
  if ((lVar4 != 0) && (-2 < (long)block->uncompressed_size)) {
    puVar5 = (undefined4 *)next->coder;
    if (puVar5 == (undefined4 *)0x0) {
      puVar5 = (undefined4 *)lzma_alloc(0xe8,allocator);
      if (puVar5 == (undefined4 *)0x0) {
        return LZMA_MEM_ERROR;
      }
      next->coder = puVar5;
      next->code = block_decode;
      next->end = block_decoder_end;
      *(undefined8 *)(puVar5 + 2) = 0;
      *(undefined8 *)(puVar5 + 4) = 0xffffffffffffffff;
      *(undefined8 *)(puVar5 + 6) = 0;
      *(undefined8 *)(puVar5 + 8) = 0;
      *(undefined8 *)(puVar5 + 10) = 0;
      *(undefined8 *)(puVar5 + 0xc) = 0;
      *(undefined8 *)(puVar5 + 0xe) = 0;
      *(undefined8 *)(puVar5 + 0x10) = 0;
      *(undefined8 *)(puVar5 + 0x12) = 0;
    }
    *puVar5 = 0;
    *(lzma_block **)(puVar5 + 0x14) = block;
    *(undefined8 *)(puVar5 + 0x16) = 0;
    *(undefined8 *)(puVar5 + 0x18) = 0;
    lVar4 = block->compressed_size;
    if (lVar4 == 0xffffffffffffffff) {
      uVar1 = block->header_size;
      type = block->check;
      uVar2 = lzma_check_size(type);
      lVar4 = 0x7ffffffffffffffc - ((ulong)uVar2 + (ulong)uVar1);
    }
    else {
      type = block->check;
    }
    *(lzma_vli *)(puVar5 + 0x1a) = lVar4;
    *(undefined8 *)(puVar5 + 0x1c) = 0;
    lzma_check_init((lzma_check_state *)(puVar5 + 0x1e),type);
    if (block->version == 0) {
      bVar6 = false;
    }
    else {
      bVar6 = block->ignore_check != '\0';
    }
    *(bool *)(puVar5 + 0x38) = bVar6;
    lVar3 = lzma_raw_decoder_init((lzma_next_coder *)(puVar5 + 2),allocator,block->filters);
    return lVar3;
  }
  return LZMA_PROG_ERROR;
}

Assistant:

extern lzma_ret
lzma_block_decoder_init(lzma_next_coder *next, const lzma_allocator *allocator,
		lzma_block *block)
{
	lzma_next_coder_init(&lzma_block_decoder_init, next, allocator);

	// Validate the options. lzma_block_unpadded_size() does that for us
	// except for Uncompressed Size and filters. Filters are validated
	// by the raw decoder.
	if (lzma_block_unpadded_size(block) == 0
			|| !lzma_vli_is_valid(block->uncompressed_size))
		return LZMA_PROG_ERROR;

	// Allocate *next->coder if needed.
	lzma_block_coder *coder = next->coder;
	if (coder == NULL) {
		coder = lzma_alloc(sizeof(lzma_block_coder), allocator);
		if (coder == NULL)
			return LZMA_MEM_ERROR;

		next->coder = coder;
		next->code = &block_decode;
		next->end = &block_decoder_end;
		coder->next = LZMA_NEXT_CODER_INIT;
	}

	// Basic initializations
	coder->sequence = SEQ_CODE;
	coder->block = block;
	coder->compressed_size = 0;
	coder->uncompressed_size = 0;

	// If Compressed Size is not known, we calculate the maximum allowed
	// value so that encoded size of the Block (including Block Padding)
	// is still a valid VLI and a multiple of four.
	coder->compressed_limit
			= block->compressed_size == LZMA_VLI_UNKNOWN
				? (LZMA_VLI_MAX & ~LZMA_VLI_C(3))
					- block->header_size
					- lzma_check_size(block->check)
				: block->compressed_size;

	// Initialize the check. It's caller's problem if the Check ID is not
	// supported, and the Block decoder cannot verify the Check field.
	// Caller can test lzma_check_is_supported(block->check).
	coder->check_pos = 0;
	lzma_check_init(&coder->check, block->check);

	coder->ignore_check = block->version >= 1
			? block->ignore_check : false;

	// Initialize the filter chain.
	return lzma_raw_decoder_init(&coder->next, allocator,
			block->filters);
}